

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O2

UINT64 ByteArrayToUint64(BYTE *a)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)a;
  return uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
}

Assistant:

UINT64 ByteArrayToUint64(BYTE* a)
{
    UINT64      retVal;
    retVal  = a[0]; retVal <<= 8;
    retVal += a[1]; retVal <<= 8;
    retVal += a[2]; retVal <<= 8;
    retVal += a[3]; retVal <<= 8;
    retVal += a[4]; retVal <<= 8;
    retVal += a[5]; retVal <<= 8;
    retVal += a[6]; retVal <<= 8;
    retVal += a[7];
    return retVal;
}